

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

int __thiscall QDockWidgetPrivate::init(QDockWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QObject *pQVar1;
  QWidget *this_00;
  QWidget *w;
  QWidget *widget;
  QAction *this_01;
  long in_FS_OFFSET;
  QAbstractButton *button;
  QDockWidgetLayout *layout;
  QDockWidget *q;
  QWidget *in_stack_fffffffffffffe38;
  code *dockWidget;
  QFont *other;
  QDockWidgetLayout *in_stack_fffffffffffffe40;
  QDockWidgetTitleButton *this_02;
  QLayout *in_stack_fffffffffffffe50;
  undefined4 uVar2;
  Role r;
  QDockWidgetLayout *this_03;
  QString *pQVar3;
  QWidget *slot;
  code *context;
  undefined8 in_stack_fffffffffffffe90;
  ConnectionType CVar4;
  Object *sender;
  Object *in_stack_fffffffffffffe98;
  Object *receiverPrivate;
  Object *in_stack_fffffffffffffea0;
  offset_in_QAbstractButton_to_subr in_stack_fffffffffffffeb0;
  Function in_stack_fffffffffffffec0;
  offset_in_QAbstractButton_to_subr in_stack_fffffffffffffed0;
  Connection *this_04;
  Connection local_a0 [7];
  code *local_68;
  undefined8 local_60;
  undefined1 local_58 [32];
  QWidgetData *pQStack_38;
  undefined1 local_30 [40];
  QLayoutItem **local_8;
  
  CVar4 = (ConnectionType)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  local_8 = *(QLayoutItem ***)(in_FS_OFFSET + 0x28);
  pQVar1 = (QObject *)q_func(this);
  this_00 = (QWidget *)operator_new(0x48);
  QDockWidgetLayout::QDockWidgetLayout(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  QLayout::setSizeConstraint(in_stack_fffffffffffffe50,(SizeConstraint)((ulong)this_00 >> 0x20));
  w = (QWidget *)operator_new(0x30);
  QDockWidgetTitleButton::QDockWidgetTitleButton
            ((QDockWidgetTitleButton *)in_stack_fffffffffffffe40,
             (QDockWidget *)in_stack_fffffffffffffe38);
  uVar2 = SUB84(w,0);
  r = (Role)((ulong)w >> 0x20);
  pQVar3 = (QString *)0x19;
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)in_stack_fffffffffffffe40);
  str.m_data._0_4_ = uVar2;
  str.m_size = (qsizetype)w;
  str.m_data._4_4_ = r;
  QAnyStringView::QAnyStringView((QAnyStringView *)this_00,str);
  QObject::setObjectName((QAnyStringView *)CONCAT44(r,uVar2));
  context = QAbstractButton::clicked;
  local_58._24_8_ = toggleTopLevel;
  pQStack_38 = (QWidgetData *)0x0;
  dockWidget = toggleTopLevel;
  this_02 = (QDockWidgetTitleButton *)0x0;
  this_03 = (QDockWidgetLayout *)local_30;
  QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QDockWidgetPrivate::*)()>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffed0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffec0,CVar4);
  CVar4 = (ConnectionType)in_stack_fffffffffffffed0;
  QMetaObject::Connection::~Connection((Connection *)this_03);
  QDockWidgetLayout::setWidgetForRole(this_03,r,w);
  widget = (QWidget *)operator_new(0x30);
  QDockWidgetTitleButton::QDockWidgetTitleButton(this_02,(QDockWidget *)dockWidget);
  slot = widget;
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)this_02);
  str_00.m_data._0_4_ = uVar2;
  str_00.m_size = (qsizetype)w;
  str_00.m_data._4_4_ = r;
  QAnyStringView::QAnyStringView((QAnyStringView *)this_00,str_00);
  QObject::setObjectName((QAnyStringView *)slot);
  local_68 = QWidget::close;
  local_60 = 0;
  other = (QFont *)((ulong)dockWidget & 0xffffffff00000000);
  sender = (Object *)local_58;
  QObject::connect<void(QAbstractButton::*)(bool),bool(QWidget::*)()>
            (sender,in_stack_fffffffffffffeb0,(ContextType *)context,
             (offset_in_QWidget_to_subr *)slot,CVar4);
  QMetaObject::Connection::~Connection((Connection *)sender);
  CVar4 = (ConnectionType)((ulong)sender >> 0x20);
  QDockWidgetLayout::setWidgetForRole(this_03,r,w);
  receiverPrivate = (Object *)(local_30 + 0x18);
  QApplication::font((char *)CONCAT44(r,uVar2));
  QFont::operator=((QFont *)this_02,other);
  QFont::~QFont((QFont *)receiverPrivate);
  this_01 = (QAction *)operator_new(0x10);
  QAction::QAction(this_01,pQVar1);
  this->toggleViewAction = this_01;
  QAction::setCheckable(SUB81(this->toggleViewAction,0));
  QAction::setMenuRole((MenuRole)this->toggleViewAction);
  QWidget::windowTitle(this_00);
  qt_setWindowTitle_helperHelper(pQVar3,widget);
  pQVar3 = &this->fixedWindowTitle;
  QString::operator=((QString *)this_02,(QString *)other);
  QString::~QString((QString *)0x58c5d8);
  QString::~QString((QString *)0x58c5e5);
  QAction::setText((QString *)this->toggleViewAction);
  this_04 = local_a0;
  QObjectPrivate::connect<void(QAction::*)(bool),void(QDockWidgetPrivate::*)(bool)>
            (this_01,(offset_in_QAction_to_subr)this_04,receiverPrivate,(Function)pQVar3,CVar4);
  QMetaObject::Connection::~Connection(this_04);
  updateButtons(this);
  if (*(QLayoutItem ***)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(QLayoutItem ***)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetPrivate::init()
{
    Q_Q(QDockWidget);

    QDockWidgetLayout *layout = new QDockWidgetLayout(q);
    layout->setSizeConstraint(QLayout::SetMinAndMaxSize);

    QAbstractButton *button = new QDockWidgetTitleButton(q);
    button->setObjectName("qt_dockwidget_floatbutton"_L1);
    QObjectPrivate::connect(button, &QAbstractButton::clicked,
                            this, &QDockWidgetPrivate::toggleTopLevel);
    layout->setWidgetForRole(QDockWidgetLayout::FloatButton, button);

    button = new QDockWidgetTitleButton(q);
    button->setObjectName("qt_dockwidget_closebutton"_L1);
    QObject::connect(button, &QAbstractButton::clicked, q, &QDockWidget::close);
    layout->setWidgetForRole(QDockWidgetLayout::CloseButton, button);

    font = QApplication::font("QDockWidgetTitle");

#ifndef QT_NO_ACTION
    toggleViewAction = new QAction(q);
    toggleViewAction->setCheckable(true);
    toggleViewAction->setMenuRole(QAction::NoRole);
    fixedWindowTitle = qt_setWindowTitle_helperHelper(q->windowTitle(), q);
    toggleViewAction->setText(fixedWindowTitle);
    QObjectPrivate::connect(toggleViewAction, &QAction::triggered,
                            this, &QDockWidgetPrivate::toggleView);
#endif

    updateButtons();
}